

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.cpp
# Opt level: O0

string * Tools::substring(string *s,size_t begin,size_t end)

{
  invalid_argument *this;
  ulong in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  string *in_RDI;
  out_of_range *range_error;
  
  if (in_RCX < in_RDX) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"\'begin\' can\'t be larger than \'end\'");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::substr((ulong)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

string Tools::substring(string s, size_t begin, size_t end) {
    if (begin > end) throw std::invalid_argument("'begin' can't be larger than 'end'");
    try {
        return s.substr(begin, end - begin);
    }
    catch (std::out_of_range &range_error) {
        return "";
    }
}